

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

QString * escapeHtml(QString *__return_storage_ptr__,QString *input)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  QArrayData *pQVar4;
  int iVar5;
  storage_type *psVar6;
  storage_type *psVar7;
  size_t sVar8;
  longlong lVar9;
  char *__s;
  int iVar10;
  QByteArrayView QVar11;
  QArrayData *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pDVar2 = (input->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (input->d).ptr;
  (__return_storage_ptr__->d).size = (input->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (0 < (__return_storage_ptr__->d).size) {
    lVar9 = 0;
    iVar10 = 0;
    do {
      cVar1 = (__return_storage_ptr__->d).ptr[lVar9];
      if ((ushort)cVar1 < 0x3c) {
        if (cVar1 == L'\"') {
          bVar3 = false;
          __s = "&quot;";
        }
        else if (cVar1 == L'&') {
          bVar3 = false;
          __s = "&amp;";
        }
        else {
LAB_001159fa:
          bVar3 = true;
          __s = (char *)0x0;
        }
      }
      else if (cVar1 == L'>') {
        bVar3 = false;
        __s = "&gt;";
      }
      else {
        if (cVar1 != L'<') goto LAB_001159fa;
        bVar3 = false;
        __s = "&lt;";
      }
      iVar5 = 1;
      if (!bVar3) {
        psVar6 = (storage_type *)strlen(__s);
        psVar7 = psVar6;
        if ((long)psVar6 < 1) {
          psVar7 = (storage_type *)0x0;
        }
        if ((long)psVar6 < 0) {
          psVar7 = (storage_type *)strlen(__s);
        }
        QVar11.m_data = psVar7;
        QVar11.m_size = (qsizetype)&local_48;
        QString::fromLatin1(QVar11);
        pQVar4 = local_48;
        uStack_38 = 0;
        local_40 = 0;
        local_48 = (QArrayData *)0x0;
        QString::replace((longlong)__return_storage_ptr__,lVar9,(QString *)0x1);
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,8);
          }
        }
        sVar8 = strlen(__s);
        iVar5 = (int)sVar8;
      }
      iVar10 = iVar10 + iVar5;
      lVar9 = (longlong)iVar10;
    } while (lVar9 < (__return_storage_ptr__->d).size);
  }
  return __return_storage_ptr__;
}

Assistant:

QString escapeHtml(const QString& input)
{
	QString escaped(input);
	for (int i=0; i < escaped.length();) {
		const char* replacement = 0;
		ushort ch = escaped.at(i).unicode();
		if (ch == '&') {
			replacement = "&amp;";
		} else if (ch == '<') {
			replacement = "&lt;";
		} else if (ch == '>') {
			replacement = "&gt;";
		} else if (ch == '"') {
			replacement = "&quot;";
		}
		if (replacement) {
			escaped.replace(i, 1, QLatin1String(replacement));
			i += (int)strlen(replacement);
		} else {
			++i;
		}
	}
	return escaped;
}